

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

ssize_t detect_line(h1_req_parser *parser,char *buf,size_t buflen,CURLcode *err)

{
  void *pvVar1;
  char *line_end;
  CURLcode *err_local;
  size_t buflen_local;
  char *buf_local;
  h1_req_parser *parser_local;
  
  pvVar1 = memchr(buf,10,buflen);
  if (pvVar1 == (void *)0x0) {
    *err = CURLE_AGAIN;
    parser_local = (h1_req_parser *)0xffffffffffffffff;
  }
  else {
    parser->line = buf;
    parser->line_len = (long)pvVar1 + (1 - (long)buf);
    *err = CURLE_OK;
    parser_local = (h1_req_parser *)parser->line_len;
  }
  return (ssize_t)parser_local;
}

Assistant:

static ssize_t detect_line(struct h1_req_parser *parser,
                           const char *buf, const size_t buflen,
                           CURLcode *err)
{
  const char  *line_end;

  DEBUGASSERT(!parser->line);
  line_end = memchr(buf, '\n', buflen);
  if(!line_end) {
    *err = CURLE_AGAIN;
    return -1;
  }
  parser->line = buf;
  parser->line_len = line_end - buf + 1;
  *err = CURLE_OK;
  return (ssize_t)parser->line_len;
}